

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id,
          TIntermTyped *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TConstUnionArray *this_00;
  TConstUnion *this_01;
  iterator __first;
  iterator __last;
  iterator __result;
  char *pcVar3;
  uint local_44;
  int value;
  TIntermConstantUnion *constUnion;
  char *feature;
  TIntermTyped *node_local;
  TString *id_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  integerCheck(this,node,"layout-id value");
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])();
  local_44 = 0;
  if ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar2) != (TIntermConstantUnion *)0x0) {
    this_00 = TIntermConstantUnion::getConstArray
                        ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar2));
    this_01 = TConstUnionArray::operator[](this_00,0);
    local_44 = TConstUnion::getIConst(this_01);
  }
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::begin(id);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::end(id);
  __result = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin(id);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__last._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__result._M_current,tolower);
  bVar1 = std::operator==(id,"offset");
  if (bVar1) {
    qualifier->layoutOffset = local_44;
  }
  else {
    bVar1 = std::operator==(id,"align");
    if (bVar1) {
      bVar1 = IsPow2<int>(local_44);
      if (bVar1) {
        qualifier->layoutAlign = local_44;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"must be a power of 2","align","");
      }
    }
    else {
      bVar1 = std::operator==(id,"location");
      if (bVar1) {
        if (local_44 < 0xfff) {
          *(ulong *)&qualifier->field_0x1c =
               *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)local_44 & 0xfff;
        }
        else {
          pcVar3 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (id);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"location is too large",pcVar3,"");
        }
      }
      else {
        bVar1 = std::operator==(id,"set");
        if (bVar1) {
          if (local_44 < 0x3f) {
            *(ulong *)&qualifier->field_0x1c =
                 *(ulong *)&qualifier->field_0x1c & 0xffffffffffc07fff |
                 ((ulong)local_44 & 0x7f) << 0xf;
          }
          else {
            pcVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(id);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"set is too large",pcVar3,"");
          }
        }
        else {
          bVar1 = std::operator==(id,"binding");
          if (bVar1) {
            if (local_44 < 0xffff) {
              *(ulong *)&qualifier->field_0x1c =
                   *(ulong *)&qualifier->field_0x1c & 0xffff0000ffffffff |
                   ((ulong)local_44 & 0xffff) << 0x20;
            }
            else {
              pcVar3 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(id);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"binding is too large",pcVar3,"");
            }
          }
          else {
            bVar1 = std::operator==(id,"component");
            if (bVar1) {
              if (local_44 < 4) {
                *(ulong *)&qualifier->field_0x1c =
                     *(ulong *)&qualifier->field_0x1c & 0xffffffffffff8fff |
                     ((ulong)local_44 & 7) << 0xc;
              }
              else {
                pcVar3 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::c_str(id);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"component is too large",pcVar3,"");
              }
            }
            else {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,0,4,"xfb_");
              if (iVar2 == 0) {
                TIntermediate::setXfbMode
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate);
                bVar1 = std::operator==(id,"xfb_buffer");
                if (bVar1) {
                  if ((this->super_TParseContextBase).resources.maxTransformFeedbackBuffers <=
                      (int)local_44) {
                    pcVar3 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             ::c_str(id);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,loc,"buffer is too large:",pcVar3,
                              "gl_MaxTransformFeedbackBuffers is %d",
                              (ulong)(uint)(this->super_TParseContextBase).resources.
                                           maxTransformFeedbackBuffers);
                  }
                  if (0xe < (int)local_44) {
                    pcVar3 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             ::c_str(id);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,loc,"buffer is too large:",pcVar3,"internal max is %d",0xe);
                    return;
                  }
                  *(ulong *)&qualifier->field_0x24 =
                       *(ulong *)&qualifier->field_0x24 & 0xfffffffffffffff0 | (ulong)local_44 & 0xf
                  ;
                  return;
                }
                bVar1 = std::operator==(id,"xfb_offset");
                if (bVar1) {
                  if (0x1ffe < (int)local_44) {
                    pcVar3 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             ::c_str(id);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,loc,"offset is too large:",pcVar3,"internal max is %d",0x1ffe);
                    return;
                  }
                  *(ulong *)&qualifier->field_0x24 =
                       *(ulong *)&qualifier->field_0x24 & 0xffffffff8003ffff |
                       ((ulong)local_44 & 0x1fff) << 0x12;
                  return;
                }
                bVar1 = std::operator==(id,"xfb_stride");
                if (bVar1) {
                  if ((this->super_TParseContextBase).resources.
                      maxTransformFeedbackInterleavedComponents * 4 < (int)local_44) {
                    pcVar3 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             ::c_str(id);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,loc,"1/4 stride is too large:",pcVar3,
                              "gl_MaxTransformFeedbackInterleavedComponents is %d",
                              (ulong)(uint)(this->super_TParseContextBase).resources.
                                           maxTransformFeedbackInterleavedComponents);
                  }
                  else if (0x3ffe < (int)local_44) {
                    pcVar3 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             ::c_str(id);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,loc,"stride is too large:",pcVar3,"internal max is %d",0x3ffe);
                  }
                  if (0x3ffe < (int)local_44) {
                    return;
                  }
                  *(ulong *)&qualifier->field_0x24 =
                       *(ulong *)&qualifier->field_0x24 & 0xfffffffffffc000f |
                       ((ulong)local_44 & 0x3fff) << 4;
                  return;
                }
              }
              bVar1 = std::operator==(id,"input_attachment_index");
              if (bVar1) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                          (this,loc,"input_attachment_index");
                if ((int)local_44 < 0xff) {
                  *(ulong *)&qualifier->field_0x24 =
                       *(ulong *)&qualifier->field_0x24 & 0xffffff00ffffffff |
                       ((ulong)local_44 & 0xff) << 0x20;
                }
                else {
                  pcVar3 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           ::c_str(id);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"attachment index is too large",pcVar3,"");
                }
              }
              else {
                bVar1 = std::operator==(id,"constant_id");
                if (bVar1) {
                  setSpecConstantId(this,loc,qualifier,local_44);
                }
                else {
                  switch((this->super_TParseContextBase).super_TParseVersions.language) {
                  case EShLangVertex:
                    break;
                  case EShLangTessControl:
                    bVar1 = std::operator==(id,"vertices");
                    if (bVar1) {
                      if (local_44 == 0) {
                        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x2d])(this,loc,"must be greater than 0","vertices","");
                        return;
                      }
                      pcVar3 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               ::c_str(id);
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2e])(this,loc,"ignored",pcVar3,"");
                      return;
                    }
                    break;
                  case EShLangTessEvaluation:
                    break;
                  case EShLangGeometry:
                    bVar1 = std::operator==(id,"invocations");
                    if (bVar1) {
                      if (local_44 == 0) {
                        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x2d])(this,loc,"must be at least 1","invocations","");
                        return;
                      }
                      pcVar3 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               ::c_str(id);
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2e])(this,loc,"ignored",pcVar3,"");
                      return;
                    }
                    bVar1 = std::operator==(id,"max_vertices");
                    if (bVar1) {
                      pcVar3 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               ::c_str(id);
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2e])(this,loc,"ignored",pcVar3,"");
                      if ((int)local_44 <=
                          (this->super_TParseContextBase).resources.maxGeometryOutputVertices) {
                        return;
                      }
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2d])(this,loc,"too large, must be less than gl_MaxGeometryOutputVertices"
                                ,"max_vertices","");
                      return;
                    }
                    bVar1 = std::operator==(id,"stream");
                    if (bVar1) {
                      *(ulong *)&qualifier->field_0x1c =
                           *(ulong *)&qualifier->field_0x1c & 0xffffffffffffff |
                           (ulong)local_44 << 0x38;
                      return;
                    }
                    break;
                  case EShLangFragment:
                    bVar1 = std::operator==(id,"index");
                    if (bVar1) {
                      *(ulong *)&qualifier->field_0x1c =
                           *(ulong *)&qualifier->field_0x1c & 0xff00ffffffffffff |
                           ((ulong)local_44 & 0xff) << 0x30;
                      return;
                    }
                    break;
                  case EShLangCompute:
                    iVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::compare(id,0,0xb,"local_size_");
                    if (iVar2 == 0) {
                      bVar1 = std::operator==(id,"local_size_x");
                      if (bVar1) {
                        pcVar3 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 ::c_str(id);
                        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x2e])(this,loc,"ignored",pcVar3,"");
                        return;
                      }
                      bVar1 = std::operator==(id,"local_size_y");
                      if (bVar1) {
                        pcVar3 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 ::c_str(id);
                        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x2e])(this,loc,"ignored",pcVar3,"");
                        return;
                      }
                      bVar1 = std::operator==(id,"local_size_z");
                      if (bVar1) {
                        pcVar3 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 ::c_str(id);
                        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x2e])(this,loc,"ignored",pcVar3,"");
                        return;
                      }
                      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0)
                      {
                        bVar1 = std::operator==(id,"local_size_x_id");
                        if (bVar1) {
                          pcVar3 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   ::c_str(id);
                          (*(this->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[0x2e])(this,loc,"ignored",pcVar3,"");
                          return;
                        }
                        bVar1 = std::operator==(id,"local_size_y_id");
                        if (bVar1) {
                          pcVar3 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   ::c_str(id);
                          (*(this->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[0x2e])(this,loc,"ignored",pcVar3,"");
                          return;
                        }
                        bVar1 = std::operator==(id,"local_size_z_id");
                        if (bVar1) {
                          pcVar3 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   ::c_str(id);
                          (*(this->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[0x2e])(this,loc,"ignored",pcVar3,"");
                          return;
                        }
                      }
                    }
                  }
                  pcVar3 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           ::c_str(id);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,
                             "there is no such layout identifier for this stage taking an assigned value"
                             ,pcVar3,"");
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id,
                                          const TIntermTyped* node)
{
    const char* feature = "layout-id value";
    // const char* nonLiteralFeature = "non-literal layout-id value";

    integerCheck(node, feature);
    const TIntermConstantUnion* constUnion = node->getAsConstantUnion();
    int value = 0;
    if (constUnion) {
        value = constUnion->getConstArray()[0].getIConst();
    }

    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == "offset") {
        qualifier.layoutOffset = value;
        return;
    } else if (id == "align") {
        // "The specified alignment must be a power of 2, or a compile-time error results."
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "align", "");
        else
            qualifier.layoutAlign = value;
        return;
    } else if (id == "location") {
        if ((unsigned int)value >= TQualifier::layoutLocationEnd)
            error(loc, "location is too large", id.c_str(), "");
        else
            qualifier.layoutLocation = value;
        return;
    } else if (id == "set") {
        if ((unsigned int)value >= TQualifier::layoutSetEnd)
            error(loc, "set is too large", id.c_str(), "");
        else
            qualifier.layoutSet = value;
        return;
    } else if (id == "binding") {
        if ((unsigned int)value >= TQualifier::layoutBindingEnd)
            error(loc, "binding is too large", id.c_str(), "");
        else
            qualifier.layoutBinding = value;
        return;
    } else if (id == "component") {
        if ((unsigned)value >= TQualifier::layoutComponentEnd)
            error(loc, "component is too large", id.c_str(), "");
        else
            qualifier.layoutComponent = value;
        return;
    } else if (id.compare(0, 4, "xfb_") == 0) {
        // "Any shader making any static use (after preprocessing) of any of these
        // *xfb_* qualifiers will cause the shader to be in a transform feedback
        // capturing mode and hence responsible for describing the transform feedback
        // setup."
        intermediate.setXfbMode();
        if (id == "xfb_buffer") {
            // "It is a compile-time error to specify an *xfb_buffer* that is greater than
            // the implementation-dependent constant gl_MaxTransformFeedbackBuffers."
            if (value >= resources.maxTransformFeedbackBuffers)
                error(loc, "buffer is too large:", id.c_str(), "gl_MaxTransformFeedbackBuffers is %d",
                      resources.maxTransformFeedbackBuffers);
            if (value >= (int)TQualifier::layoutXfbBufferEnd)
                error(loc, "buffer is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbBufferEnd - 1);
            else
                qualifier.layoutXfbBuffer = value;
            return;
        } else if (id == "xfb_offset") {
            if (value >= (int)TQualifier::layoutXfbOffsetEnd)
                error(loc, "offset is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbOffsetEnd - 1);
            else
                qualifier.layoutXfbOffset = value;
            return;
        } else if (id == "xfb_stride") {
            // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
            // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
            if (value > 4 * resources.maxTransformFeedbackInterleavedComponents)
                error(loc, "1/4 stride is too large:", id.c_str(), "gl_MaxTransformFeedbackInterleavedComponents is %d",
                      resources.maxTransformFeedbackInterleavedComponents);
            else if (value >= (int)TQualifier::layoutXfbStrideEnd)
                error(loc, "stride is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbStrideEnd - 1);
            if (value < (int)TQualifier::layoutXfbStrideEnd)
                qualifier.layoutXfbStride = value;
            return;
        }
    }

    if (id == "input_attachment_index") {
        requireVulkan(loc, "input_attachment_index");
        if (value >= (int)TQualifier::layoutAttachmentEnd)
            error(loc, "attachment index is too large", id.c_str(), "");
        else
            qualifier.layoutAttachment = value;
        return;
    }
    if (id == "constant_id") {
        setSpecConstantId(loc, qualifier, value);
        return;
    }

    switch (language) {
    case EShLangVertex:
        break;

    case EShLangTessControl:
        if (id == "vertices") {
            if (value == 0)
                error(loc, "must be greater than 0", "vertices", "");
            else
                // publicType.shaderQualifiers.vertices = value;
                warn(loc, "ignored", id.c_str(), "");
            return;
        }
        break;

    case EShLangTessEvaluation:
        break;

    case EShLangGeometry:
        if (id == "invocations") {
            if (value == 0)
                error(loc, "must be at least 1", "invocations", "");
            else
                // publicType.shaderQualifiers.invocations = value;
                warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "max_vertices") {
            // publicType.shaderQualifiers.vertices = value;
            warn(loc, "ignored", id.c_str(), "");
            if (value > resources.maxGeometryOutputVertices)
                error(loc, "too large, must be less than gl_MaxGeometryOutputVertices", "max_vertices", "");
            return;
        }
        if (id == "stream") {
            qualifier.layoutStream = value;
            return;
        }
        break;

    case EShLangFragment:
        if (id == "index") {
            qualifier.layoutIndex = value;
            return;
        }
        break;

    case EShLangCompute:
        if (id.compare(0, 11, "local_size_") == 0) {
            if (id == "local_size_x") {
                // publicType.shaderQualifiers.localSize[0] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == "local_size_y") {
                // publicType.shaderQualifiers.localSize[1] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == "local_size_z") {
                // publicType.shaderQualifiers.localSize[2] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (spvVersion.spv != 0) {
                if (id == "local_size_x_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[0] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
                if (id == "local_size_y_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[1] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
                if (id == "local_size_z_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[2] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
            }
        }
        break;

    default:
        break;
    }

    error(loc, "there is no such layout identifier for this stage taking an assigned value", id.c_str(), "");
}